

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O2

void gf_25519_mulw_unsigned(gf_25519_s *cs,gf_25519_s *as,uint32_t b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong a;
  ulong uVar5;
  ulong local_48;
  long local_40;
  
  a = CONCAT44(0,b);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = as->limb[0];
  uVar3 = SUB168(auVar1 * auVar2,0);
  local_48 = SUB168(auVar1 * auVar2,8) << 0xd | uVar3 >> 0x33;
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,a,as->limb + 1);
  uVar4 = local_40 << 0xd;
  uVar5 = local_48 & 0x7ffffffffffff;
  local_40 = 0;
  local_48 = uVar4 | local_48 >> 0x33;
  mac_rm((__uint128_t *)&local_48,a,as->limb + 2);
  uVar4 = local_40 << 0xd;
  cs->limb[2] = local_48 & 0x7ffffffffffff;
  local_40 = 0;
  local_48 = uVar4 | local_48 >> 0x33;
  mac_rm((__uint128_t *)&local_48,a,as->limb + 3);
  uVar4 = local_40 << 0xd;
  cs->limb[3] = local_48 & 0x7ffffffffffff;
  local_40 = 0;
  local_48 = uVar4 | local_48 >> 0x33;
  mac_rm((__uint128_t *)&local_48,a,as->limb + 4);
  cs->limb[4] = local_48 & 0x7ffffffffffff;
  uVar4 = (local_40 << 0xd | local_48 >> 0x33) * 0x13 + (uVar3 & 0x7ffffffffffff);
  cs->limb[0] = uVar4 & 0x7ffffffffffff;
  cs->limb[1] = (uVar4 >> 0x33) + uVar5;
  return;
}

Assistant:

void gf_mulw_unsigned (gf_s *__restrict__ cs, const gf as, uint32_t b) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;

    __uint128_t accum = widemul_rm(b, &a[0]);
    uint64_t c0 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[1]);
    uint64_t c1 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[2]);
    c[2] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[3]);
    c[3] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[4]);
    c[4] = accum & mask;

    uint64_t a1 = shrld(accum,51);
    a1 = a1*19+c0;
    
    c[0] = a1 & mask;
    c[1] = c1 + (a1>>51);
}